

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

DeferredFunctionStub * __thiscall
Memory::AllocateArray<Memory::Recycler,DeferredFunctionStub,false>
          (Memory *this,Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  DeferredFunctionStub *pDVar2;
  DeferredFunctionStub *pDVar3;
  size_t byteSize;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pDVar2 = (DeferredFunctionStub *)0x8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x68),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x68),0);
    }
    pDVar2 = (DeferredFunctionStub *)
             new__<Memory::Recycler>
                       (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    pDVar3 = pDVar2;
    do {
      *(undefined4 *)((long)&(pDVar3->restorePoint).m_cMinTokMultiUnits + 4) = 0xffffffff;
      *(undefined4 *)&(pDVar3->restorePoint).m_cMinLineMultiUnits = 0xffffffff;
      *(undefined4 *)((long)&(pDVar3->restorePoint).m_cMinLineMultiUnits + 4) = 0xffffffff;
      (pDVar3->restorePoint).m_line = 0xffffffff;
      (pDVar3->restorePoint).m_ichMinTok = 0xffffffff;
      (pDVar3->restorePoint).m_ichMinLine = 0xffffffff;
      *(undefined4 *)&(pDVar3->restorePoint).m_cMinTokMultiUnits = 0xffffffff;
      *(undefined4 *)((long)&(pDVar3->restorePoint).m_cMinTokMultiUnits + 4) = 0xffffffff;
      *(undefined8 *)&(pDVar3->restorePoint).functionIdIncrement = 0;
      *(undefined8 *)((long)&(pDVar3->restorePoint).lengthDecr + 4) = 0;
      (pDVar3->restorePoint).m_cMultiUnits = 0xffffffffffffffff;
      (pDVar3->capturedNameSerializedIds).ptr = (int *)0x0;
      (pDVar3->capturedNamePointers).ptr =
           (BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            *)0x0;
      (pDVar3->deferredStubs).ptr = (DeferredFunctionStub *)0x0;
      (pDVar3->byteCodeCache).ptr = (ByteCodeCache *)0x0;
      pDVar3 = pDVar3 + 1;
    } while (pDVar3 != pDVar2 + count);
  }
  return pDVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}